

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSA_SpikeEncodingSynapse.cpp
# Opt level: O1

void __thiscall BSA_SpikeEncodingSynapse::update(BSA_SpikeEncodingSynapse *this)

{
  ulong uVar1;
  pointer pdVar2;
  _Elt_pointer pdVar3;
  BSA_SpikeEncodingSynapse_param *pBVar4;
  pointer pdVar5;
  Population *pPVar6;
  Event *pEVar7;
  Clock *pCVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  double *pdVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  Clock::getCurrentTime(this->clock);
  resetOutput(this);
  if (0 < this->inputSize) {
    uVar15 = 0;
    do {
      pEVar7 = (((this->super_Synapse).from_population)->output).
               super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data
               ._M_start[uVar15];
      if (pEVar7->type == Value) {
        pdVar2 = (this->input).
                 super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pEVar7 = pEVar7 + 1;
        pdVar12 = pdVar2[uVar15].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
        if (pdVar12 ==
            pdVar2[uVar15].super__Deque_base<double,_std::allocator<double>_>._M_impl.
            super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                    ((deque<double,std::allocator<double>> *)(pdVar2 + uVar15),(double *)pEVar7);
        }
        else {
          *pdVar12 = (double)pEVar7->_vptr_Event;
          *(double **)((deque<double,std::allocator<double>> *)(pdVar2 + uVar15) + 0x30) =
               pdVar12 + 1;
        }
        std::deque<double,_std::allocator<double>_>::pop_front
                  ((this->input).
                   super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar15);
        dVar16 = this->param->filter_length;
        dVar18 = 0.0;
        dVar17 = 0.0;
        if (0.0 < dVar16) {
          pdVar2 = (this->input).
                   super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar3 = pdVar2[uVar15].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur;
          lVar9 = (long)pdVar3 -
                  (long)pdVar2[uVar15].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first;
          lVar10 = lVar9 >> 3;
          lVar11 = 0;
          do {
            uVar1 = lVar10 + lVar11;
            if (uVar1 < 0x40) {
              pdVar12 = pdVar3 + lVar11;
            }
            else {
              uVar14 = uVar1 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar1) {
                uVar14 = uVar1 >> 6;
              }
              pdVar12 = (double *)
                        ((long)pdVar2[uVar15].super__Deque_base<double,_std::allocator<double>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_node[uVar14] +
                        lVar9 + uVar14 * -0x200);
            }
            if (uVar1 < 0x40) {
              pdVar13 = pdVar3 + lVar11;
            }
            else {
              uVar14 = uVar1 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar1) {
                uVar14 = uVar1 >> 6;
              }
              pdVar13 = (double *)
                        ((long)pdVar2[uVar15].super__Deque_base<double,_std::allocator<double>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_node[uVar14] +
                        lVar9 + uVar14 * -0x200);
            }
            dVar18 = dVar18 + ABS(*pdVar12 -
                                  (this->filter).super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar11]);
            lVar11 = lVar11 + 1;
            dVar17 = dVar17 + ABS(*pdVar13);
            lVar9 = lVar9 + 8;
          } while ((double)(int)lVar11 < dVar16);
        }
        if (dVar18 <= dVar17 - this->param->threshold) {
          pEVar7 = (Event *)operator_new(0x28);
          pEVar7->_vptr_Event = (_func_int **)&PTR_setWeight_00114a60;
          *(undefined4 *)&pEVar7[1]._vptr_Event = 1;
          *(undefined8 *)&pEVar7[1].type = 0x3ff0000000000000;
          pEVar7->type = Spike;
          pCVar8 = Clock::getInstance();
          dVar16 = Clock::getCurrentTime(pCVar8);
          pEVar7->eventTime = dVar16;
          (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar15] = pEVar7;
          (**(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar15]->_vptr_Event)(0x408c200000000000);
          Logging::logEvent(this->logger,(long)this,(int)uVar15,
                            (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar15]->type);
          pBVar4 = this->param;
          if (0.0 < pBVar4->filter_length) {
            pdVar5 = (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar2 = (this->input).
                     super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar3 = pdVar2[uVar15].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur;
            lVar9 = (long)pdVar3 -
                    (long)pdVar2[uVar15].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first;
            lVar10 = lVar9 >> 3;
            lVar11 = 0;
            do {
              uVar1 = lVar10 + lVar11;
              if (uVar1 < 0x40) {
                pdVar12 = pdVar3 + lVar11;
              }
              else {
                uVar14 = uVar1 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar1) {
                  uVar14 = uVar1 >> 6;
                }
                pdVar12 = (double *)
                          ((long)pdVar2[uVar15].super__Deque_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Deque_impl_data._M_start._M_node[uVar14] +
                          lVar9 + uVar14 * -0x200);
              }
              *pdVar12 = *pdVar12 - pdVar5[lVar11];
              lVar11 = lVar11 + 1;
              lVar9 = lVar9 + 8;
            } while ((double)(int)lVar11 < pBVar4->filter_length);
          }
        }
        else {
          pEVar7 = (Event *)operator_new(0x18);
          pEVar7->type = No;
          pEVar7->_vptr_Event = (_func_int **)&PTR_setWeight_00114ad8;
          pCVar8 = Clock::getInstance();
          dVar16 = Clock::getCurrentTime(pCVar8);
          pEVar7->eventTime = dVar16;
          (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar15] = pEVar7;
        }
        pPVar6 = (this->super_Synapse).to_population;
        (*pPVar6->_vptr_Population[5])
                  (pPVar6,uVar15 & 0xffffffff,
                   (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar15]);
      }
      uVar15 = uVar15 + 1;
    } while ((long)uVar15 < (long)this->inputSize);
  }
  return;
}

Assistant:

void BSA_SpikeEncodingSynapse::update() {
    double currentTime = clock->getCurrentTime();
    resetOutput();
    for(int i = 0; i < inputSize; i++) {
        if(from_population->output[i]->type == EventType::Value) {
            input[i].push_back(static_cast<ValueEvent*>(from_population->output[i])->value);
            input[i].pop_front();
            double error1 = 0;
            double error2 = 0;
            // Ben's Spiker Algorithm
            for(int j = 0; j < param->filter_length; j++) {
                error1 += abs(input[i][j] - filter[j]);
                error2 += abs(input[i][j]);
            }
            if(error1 <= (error2 - param->threshold)) {
                output[i] = new SpikeEvent();
                output[i]->setWeight(900.0);
                logger->logEvent((long)this, i, output[i]->type);
                for(int j = 0; j < param->filter_length; j++) {
                    input[i][j] -= filter[j];
                }
            }
            else {
                output[i] = new NoEvent();
            }
            to_population->setInput(i, output[i]);
        }
    }
}